

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

void __thiscall
QTextBrowserPrivate::setSource(QTextBrowserPrivate *this,QUrl *url,ResourceType type)

{
  QUrl *pQVar1;
  QWidget *w;
  QUrlPrivate *pQVar2;
  char16_t *pcVar3;
  long lVar4;
  Data *pDVar5;
  qsizetype qVar6;
  char cVar7;
  byte bVar8;
  bool bVar9;
  int iVar10;
  qsizetype qVar11;
  ulong uVar12;
  QTextDocument *pQVar13;
  QDebug *pQVar14;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QByteArrayView QVar15;
  QUrl local_180;
  QDebug local_178;
  QUrl local_170;
  QUrl local_168;
  QDebug local_160;
  QDebug local_158;
  QArrayDataPointer<char16_t> *local_150;
  QArrayDataPointer<char16_t> local_148;
  QArrayDataPointer<char16_t> local_128;
  QUrl newUrlWithoutFragment;
  QUrl currentUrlWithoutFragment;
  QArrayDataPointer<char16_t> local_f8;
  QUrl baseUrl;
  char16_t *pcStack_d0;
  ulong uStack_c8;
  QStringDecoder decoder;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  w = *(QWidget **)
       &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
        super_QWidgetPrivate.field_0x8;
  if ((w->data->widget_attributes & 0x8000) != 0) {
    QCursor::QCursor((QCursor *)&decoder,WaitCursor);
    QGuiApplication::setOverrideCursor((QCursor *)&decoder);
    QCursor::~QCursor((QCursor *)&decoder);
  }
  this->textOrSourceChanged = true;
  local_f8.size = 0;
  local_f8.d = (Data *)0x0;
  local_f8.ptr = (char16_t *)0x0;
  currentUrlWithoutFragment.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = &this->currentURL;
  QUrl::QUrl(&currentUrlWithoutFragment,pQVar1);
  decoder.super_QStringConverter.iface._0_4_ = 0;
  decoder.super_QStringConverter.iface._4_4_ = 0;
  decoder.super_QStringConverter.state.flags.
  super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
  super_QFlagsStorage<QStringConverterBase::Flag>.i =
       (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
       (QFlagsStorage<QStringConverterBase::Flag>)0x0;
  decoder.super_QStringConverter.state.internalState = 0;
  decoder.super_QStringConverter.state.remainingChars._0_4_ = 0;
  decoder.super_QStringConverter.state.remainingChars._4_4_ = 0;
  QUrl::setFragment((QString *)&currentUrlWithoutFragment,
                    (ParsingMode)(QArrayDataPointer<char16_t> *)&decoder);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&decoder);
  newUrlWithoutFragment.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::resolved(&newUrlWithoutFragment);
  decoder.super_QStringConverter.iface._0_4_ = 0;
  decoder.super_QStringConverter.iface._4_4_ = 0;
  decoder.super_QStringConverter.state.flags.
  super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
  super_QFlagsStorage<QStringConverterBase::Flag>.i =
       (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
       (QFlagsStorage<QStringConverterBase::Flag>)0x0;
  decoder.super_QStringConverter.state.internalState = 0;
  decoder.super_QStringConverter.state.remainingChars._0_4_ = 0;
  decoder.super_QStringConverter.state.remainingChars._4_4_ = 0;
  QUrl::setFragment((QString *)&newUrlWithoutFragment,
                    (ParsingMode)(QArrayDataPointer<char16_t> *)&decoder);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&decoder);
  local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_128.d._0_4_ = 0xaaaaaaaa;
  local_128.d._4_4_ = 0xaaaaaaaa;
  local_128.ptr._0_4_ = 0xaaaaaaaa;
  local_128.ptr._4_4_ = 0xaaaaaaaa;
  QUrl::fileName(&local_128,url,0x7f00000);
  if (type == UnknownResource) {
    cVar7 = QString::endsWith((QLatin1String *)&local_128,3);
    type = MarkdownResource;
    if ((cVar7 == '\0') && (cVar7 = QString::endsWith((QLatin1String *)&local_128,4), cVar7 == '\0')
       ) {
      bVar8 = QString::endsWith((QLatin1String *)&local_128,9);
      type = (uint)bVar8 + (uint)bVar8 * 2 + HtmlResource;
    }
  }
  this->currentType = type;
  cVar7 = QUrl::isValid();
  if ((cVar7 == '\0') ||
     ((bVar9 = ::operator!=(&newUrlWithoutFragment,&currentUrlWithoutFragment), !bVar9 &&
      (this->forceLoadOnSourceChange != true)))) {
    bVar9 = false;
  }
  else {
    local_58._16_4_ = 0xaaaaaaaa;
    local_58._20_4_ = 0xaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    local_58._0_4_ = 0xaaaaaaaa;
    local_58._4_4_ = 0xaaaaaaaa;
    local_58._8_4_ = 0xaaaaaaaa;
    local_58._12_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.
                           super_QFramePrivate.super_QWidgetPrivate + 0xc0))(&decoder,this,url);
    (**(code **)(*(long *)w + 0x1c8))(&local_58,w,type,&decoder);
    QUrl::~QUrl((QUrl *)&decoder);
    iVar10 = ::QVariant::typeId((QVariant *)&local_58);
    if (iVar10 == 10) {
      ::QVariant::toString();
      pQVar2 = (QUrlPrivate *)
               CONCAT44(decoder.super_QStringConverter.iface._4_4_,
                        decoder.super_QStringConverter.iface._0_4_);
      pcVar3 = (char16_t *)
               CONCAT44(decoder.super_QStringConverter.state.internalState,
                        decoder.super_QStringConverter.state.flags.
                        super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
                        super_QFlagsStorage<QStringConverterBase::Flag>.i);
      decoder.super_QStringConverter.iface._0_4_ = SUB84(local_f8.d,0);
      decoder.super_QStringConverter.iface._4_4_ = (undefined4)((ulong)local_f8.d >> 0x20);
      decoder.super_QStringConverter.state.flags.
      super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i = SUB84(local_f8.ptr,0);
      decoder.super_QStringConverter.state.internalState = (int)((ulong)local_f8.ptr >> 0x20);
      uVar12 = CONCAT44(decoder.super_QStringConverter.state.remainingChars._4_4_,
                        (undefined4)decoder.super_QStringConverter.state.remainingChars);
      decoder.super_QStringConverter.state.remainingChars._0_4_ = (undefined4)local_f8.size;
      decoder.super_QStringConverter.state.remainingChars._4_4_ =
           (undefined4)((ulong)local_f8.size >> 0x20);
      local_f8.d = (Data *)pQVar2;
      local_f8.ptr = pcVar3;
      local_f8.size = uVar12;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&decoder);
    }
    else {
      iVar10 = ::QVariant::typeId((QVariant *)&local_58);
      if (iVar10 == 0xc) {
        local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_148.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toByteArray();
        if (type == HtmlResource) {
          decoder.super_QStringConverter.state.clearFn = (ClearDataFn)&DAT_aaaaaaaaaaaaaaaa;
          decoder.super_QStringConverter.state.field_4.d[0] = &DAT_aaaaaaaaaaaaaaaa;
          decoder.super_QStringConverter.state.field_4.d[1] = &DAT_aaaaaaaaaaaaaaaa;
          decoder.super_QStringConverter.state.remainingChars._0_4_ = 0xaaaaaaaa;
          decoder.super_QStringConverter.state.remainingChars._4_4_ = 0xaaaaaaaa;
          decoder.super_QStringConverter.state.invalidChars = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          decoder.super_QStringConverter.iface._0_4_ = 0xaaaaaaaa;
          decoder.super_QStringConverter.iface._4_4_ = 0xaaaaaaaa;
          decoder.super_QStringConverter.state.flags.
          super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
          super_QFlagsStorage<QStringConverterBase::Flag>.i =
               (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
               (QFlagsStorage<QStringConverterBase::Flag>)0xaaaaaaaa;
          decoder.super_QStringConverter.state.internalState = -0x55555556;
          QVar15.m_data = (storage_type *)local_148.size;
          QVar15.m_size = (qsizetype)&decoder;
          QStringDecoder::decoderForHtml(QVar15);
          if (CONCAT44(decoder.super_QStringConverter.iface._4_4_,
                       decoder.super_QStringConverter.iface._0_4_) == 0) {
            baseUrl.d = (QUrlPrivate *)&QStringConverter::encodingInterfaces;
            pcStack_d0 = (char16_t *)0x0;
            uStack_c8 = 0;
            QStringConverter::operator=
                      (&decoder.super_QStringConverter,(QStringConverter *)&baseUrl);
            QStringConverterBase::State::clear();
          }
          local_158.stream = (Stream *)&decoder;
          local_150 = &local_148;
          QStringDecoder::EncodedData::operator_cast_to_QString
                    ((QString *)&baseUrl,(EncodedData *)&local_158);
          pcVar3 = local_f8.ptr;
          pDVar5 = local_f8.d;
          local_f8.d = (Data *)baseUrl.d;
          local_f8.ptr = pcStack_d0;
          baseUrl.d = (QUrlPrivate *)pDVar5;
          pcStack_d0 = pcVar3;
          local_f8.size = uStack_c8;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&baseUrl);
          QStringConverterBase::State::clear();
        }
        else {
          QString::fromUtf8<void>((QString *)&decoder,(QByteArray *)&local_148);
          pQVar2 = (QUrlPrivate *)
                   CONCAT44(decoder.super_QStringConverter.iface._4_4_,
                            decoder.super_QStringConverter.iface._0_4_);
          pcVar3 = (char16_t *)
                   CONCAT44(decoder.super_QStringConverter.state.internalState,
                            decoder.super_QStringConverter.state.flags.
                            super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
                            super_QFlagsStorage<QStringConverterBase::Flag>.i);
          decoder.super_QStringConverter.iface._0_4_ = SUB84(local_f8.d,0);
          decoder.super_QStringConverter.iface._4_4_ = (undefined4)((ulong)local_f8.d >> 0x20);
          decoder.super_QStringConverter.state.flags.
          super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
          super_QFlagsStorage<QStringConverterBase::Flag>.i = SUB84(local_f8.ptr,0);
          decoder.super_QStringConverter.state.internalState = (int)((ulong)local_f8.ptr >> 0x20);
          uVar12 = CONCAT44(decoder.super_QStringConverter.state.remainingChars._4_4_,
                            (undefined4)decoder.super_QStringConverter.state.remainingChars);
          decoder.super_QStringConverter.state.remainingChars._0_4_ = (undefined4)local_f8.size;
          decoder.super_QStringConverter.state.remainingChars._4_4_ =
               (undefined4)((ulong)local_f8.size >> 0x20);
          local_f8.d = (Data *)pQVar2;
          local_f8.ptr = pcVar3;
          local_f8.size = uVar12;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&decoder);
        }
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_148);
      }
    }
    if (local_f8.size == 0) {
      decoder.super_QStringConverter.iface._0_4_ = 2;
      decoder.super_QStringConverter.state.remainingChars._4_4_ = 0;
      decoder.super_QStringConverter.iface._4_4_ = 0;
      decoder.super_QStringConverter.state.flags.
      super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i =
           (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
           (QFlagsStorage<QStringConverterBase::Flag>)0x0;
      decoder.super_QStringConverter.state.internalState = 0;
      decoder.super_QStringConverter.state.remainingChars._0_4_ = 0;
      decoder.super_QStringConverter.state.invalidChars = (qsizetype)anon_var_dwarf_66827;
      QUrl::toString(&local_148,url,0);
      QString::toLatin1_helper_inplace((QString *)&baseUrl);
      if (pcStack_d0 == (char16_t *)0x0) {
        pcStack_d0 = (char16_t *)&QByteArray::_empty;
      }
      QMessageLogger::warning((char *)&decoder,"QTextBrowser: No document for %s",pcStack_d0);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&baseUrl);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    }
    qVar6 = local_f8.size;
    pcVar3 = local_f8.ptr;
    if ((w->data->widget_attributes & 0x8000) != 0) {
      qVar11 = QString::indexOf((QString *)&local_f8,(QChar)0x3e,0,CaseSensitive);
      uVar12 = qVar11 + 1U;
      if ((ulong)qVar6 < qVar11 + 1U) {
        uVar12 = qVar6;
      }
      decoder.super_QStringConverter.iface._0_4_ = (undefined4)uVar12;
      decoder.super_QStringConverter.iface._4_4_ = (undefined4)(uVar12 >> 0x20);
      decoder.super_QStringConverter.state.flags.
      super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i = SUB84(pcVar3,0);
      decoder.super_QStringConverter.state.internalState = (int)((ulong)pcVar3 >> 0x20);
      s.m_data = "<qt";
      s.m_size = 3;
      bVar9 = QStringView::startsWith((QStringView *)&decoder,s,CaseSensitive);
      if (((bVar9) &&
          (s_00.m_data = "type", s_00.m_size = 4,
          bVar9 = QStringView::contains((QStringView *)&decoder,s_00,CaseSensitive), bVar9)) &&
         (s_01.m_data = "detail", s_01.m_size = 6,
         bVar9 = QStringView::contains((QStringView *)&decoder,s_01,CaseSensitive), bVar9)) {
        QGuiApplication::restoreOverrideCursor();
        baseUrl.d = (QUrlPrivate *)QCursor::pos();
        QWhatsThis::showText((QPoint *)&baseUrl,(QString *)&local_f8,w);
        ::QVariant::~QVariant((QVariant *)&local_58);
        goto LAB_004660e9;
      }
    }
    (**(code **)(*(long *)&(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.
                           super_QFramePrivate.super_QWidgetPrivate + 0xc0))(&decoder,this,url);
    pQVar2 = (this->currentURL).d;
    (this->currentURL).d =
         (QUrlPrivate *)
         CONCAT44(decoder.super_QStringConverter.iface._4_4_,
                  decoder.super_QStringConverter.iface._0_4_);
    decoder.super_QStringConverter.iface._0_4_ = SUB84(pQVar2,0);
    decoder.super_QStringConverter.iface._4_4_ = (undefined4)((ulong)pQVar2 >> 0x20);
    QUrl::~QUrl((QUrl *)&decoder);
    ::QVariant::~QVariant((QVariant *)&local_58);
    bVar9 = true;
  }
  cVar7 = QUrl::isValid();
  if (cVar7 == '\0') {
    QUrl::operator=(&this->home,url);
  }
  if (bVar9) {
    baseUrl.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::adjusted(&baseUrl,pQVar1,0x800);
    QUrl::path((QArrayDataPointer<char16_t> *)&decoder,&baseUrl,0x7f00000);
    lVar4 = CONCAT44(decoder.super_QStringConverter.state.remainingChars._4_4_,
                     (undefined4)decoder.super_QStringConverter.state.remainingChars);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&decoder);
    if (lVar4 != 0) {
      pQVar13 = QTextEdit::document((QTextEdit *)w);
      QTextDocument::setBaseUrl((QUrl *)pQVar13);
    }
    pQVar13 = QTextEdit::document((QTextEdit *)w);
    QUrl::toString((QArrayDataPointer<char16_t> *)&decoder,pQVar1,0);
    QTextDocument::setMetaInformation((MetaInformation)pQVar13,(QString *)0x1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&decoder);
    if ((lcBrowser()::category == '\0') &&
       (iVar10 = __cxa_guard_acquire(&lcBrowser()::category), iVar10 != 0)) {
      QLoggingCategory::QLoggingCategory
                ((QLoggingCategory *)lcBrowser()::category,"qt.text.browser",QtDebugMsg);
      __cxa_atexit(QLoggingCategory::~QLoggingCategory,lcBrowser()::category,0x7fe000);
      __cxa_guard_release(&lcBrowser()::category);
    }
    if ((lcBrowser()::category[0x10] & 1) != 0) {
      decoder.super_QStringConverter.iface._0_4_ = 2;
      decoder.super_QStringConverter.iface._4_4_ = 0;
      decoder.super_QStringConverter.state.flags.
      super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i =
           (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
           (QFlagsStorage<QStringConverterBase::Flag>)0x0;
      decoder.super_QStringConverter.state.internalState = 0;
      decoder.super_QStringConverter.state.remainingChars._0_4_ = 0;
      decoder.super_QStringConverter.state.remainingChars._4_4_ = 0;
      decoder.super_QStringConverter.state.invalidChars = lcBrowser()::category._8_8_;
      QMessageLogger::debug();
      pQVar14 = QDebug::operator<<(&local_178,"loading");
      local_170.d = (QUrlPrivate *)pQVar14->stream;
      *(int *)((Stream *)local_170.d + 0x28) = *(int *)((Stream *)local_170.d + 0x28) + 1;
      ::operator<<((Stream *)&local_158,&local_170);
      pQVar14 = QDebug::operator<<(&local_158,"base");
      local_168.d = (QUrlPrivate *)pQVar14->stream;
      *(int *)((Stream *)local_168.d + 0x28) = *(int *)((Stream *)local_168.d + 0x28) + 1;
      QTextEdit::document((QTextEdit *)w);
      QTextDocument::baseUrl();
      ::operator<<((Stream *)&local_148,&local_168);
      pQVar14 = QDebug::operator<<((QDebug *)&local_148,"type");
      local_160.stream = pQVar14->stream;
      *(int *)(local_160.stream + 0x28) = *(int *)(local_160.stream + 0x28) + 1;
      ::operator<<((Stream *)&local_58,(ResourceType)&local_160);
      pQVar14 = QDebug::operator<<((QDebug *)&local_58,local_f8.size);
      QDebug::operator<<(pQVar14,"chars");
      QDebug::~QDebug((QDebug *)&local_58);
      QDebug::~QDebug(&local_160);
      QDebug::~QDebug((QDebug *)&local_148);
      QUrl::~QUrl(&local_180);
      QDebug::~QDebug((QDebug *)&local_168);
      QDebug::~QDebug(&local_158);
      QDebug::~QDebug((QDebug *)&local_170);
      QDebug::~QDebug(&local_178);
    }
    if (type == MarkdownResource) {
      QTextEdit::setMarkdown((QTextEdit *)w,(QString *)&local_f8);
    }
    else {
      QTextEdit::setHtml((QTextEdit *)w,(QString *)&local_f8);
    }
    QUrl::~QUrl(&baseUrl);
  }
  this->forceLoadOnSourceChange = false;
  QUrl::fragment((QArrayDataPointer<char16_t> *)&decoder,url,0);
  lVar4 = CONCAT44(decoder.super_QStringConverter.state.remainingChars._4_4_,
                   (undefined4)decoder.super_QStringConverter.state.remainingChars);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&decoder);
  if (lVar4 == 0) {
    QAbstractSlider::setValue
              (&((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                super_QAbstractSlider,0);
    QAbstractSlider::setValue
              (&((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.vbar)->
                super_QAbstractSlider,0);
  }
  else {
    QUrl::fragment((QArrayDataPointer<char16_t> *)&decoder,url,0);
    QTextEdit::scrollToAnchor((QTextEdit *)w,(QString *)&decoder);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&decoder);
  }
  if ((w->data->widget_attributes & 0x8000) != 0) {
    QGuiApplication::restoreOverrideCursor();
  }
  QTextBrowser::sourceChanged((QTextBrowser *)w,url);
LAB_004660e9:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  QUrl::~QUrl(&newUrlWithoutFragment);
  QUrl::~QUrl(&currentUrlWithoutFragment);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextBrowserPrivate::setSource(const QUrl &url, QTextDocument::ResourceType type)
{
    Q_Q(QTextBrowser);
#ifndef QT_NO_CURSOR
    if (q->isVisible())
        QGuiApplication::setOverrideCursor(Qt::WaitCursor);
#endif
    textOrSourceChanged = true;

    QString txt;

    bool doSetText = false;

    QUrl currentUrlWithoutFragment = currentURL;
    currentUrlWithoutFragment.setFragment(QString());
    QUrl newUrlWithoutFragment = currentURL.resolved(url);
    newUrlWithoutFragment.setFragment(QString());
    QString fileName = url.fileName();
    if (type == QTextDocument::UnknownResource) {
#if QT_CONFIG(textmarkdownreader)
        if (fileName.endsWith(".md"_L1) ||
                fileName.endsWith(".mkd"_L1) ||
                fileName.endsWith(".markdown"_L1))
            type = QTextDocument::MarkdownResource;
        else
#endif
            type = QTextDocument::HtmlResource;
    }
    currentType = type;

    if (url.isValid()
        && (newUrlWithoutFragment != currentUrlWithoutFragment || forceLoadOnSourceChange)) {
        QVariant data = q->loadResource(type, resolveUrl(url));
        if (data.userType() == QMetaType::QString) {
            txt = data.toString();
        } else if (data.userType() == QMetaType::QByteArray) {
            QByteArray ba = data.toByteArray();
            if (type == QTextDocument::HtmlResource) {
                auto decoder = QStringDecoder::decoderForHtml(ba);
                if (!decoder.isValid())
                    // fall back to utf8
                    decoder = QStringDecoder(QStringDecoder::Utf8);
                txt = decoder(ba);
            } else {
                txt = QString::fromUtf8(ba);
            }
        }
        if (Q_UNLIKELY(txt.isEmpty()))
            qWarning("QTextBrowser: No document for %s", url.toString().toLatin1().constData());

        if (q->isVisible()) {
            const QStringView firstTag = QStringView{txt}.left(txt.indexOf(u'>') + 1);
            if (firstTag.startsWith("<qt"_L1) && firstTag.contains("type"_L1) && firstTag.contains("detail"_L1)) {
#ifndef QT_NO_CURSOR
                QGuiApplication::restoreOverrideCursor();
#endif
#if QT_CONFIG(whatsthis)
                QWhatsThis::showText(QCursor::pos(), txt, q);
#endif
                return;
            }
        }

        currentURL = resolveUrl(url);
        doSetText = true;
    }

    if (!home.isValid())
        home = url;

    if (doSetText) {
        // Setting the base URL helps QTextDocument::resource() to find resources with relative paths.
        // But don't set it unless it contains the document's path, because QTextBrowserPrivate::resolveUrl()
        // can already deal with local files on the filesystem in case the base URL was not set.
        QUrl baseUrl = currentURL.adjusted(QUrl::RemoveFilename);
        if (!baseUrl.path().isEmpty())
            q->document()->setBaseUrl(baseUrl);
        q->document()->setMetaInformation(QTextDocument::DocumentUrl, currentURL.toString());
        qCDebug(lcBrowser) << "loading" << currentURL << "base" << q->document()->baseUrl() << "type" << type << txt.size() << "chars";
#if QT_CONFIG(textmarkdownreader)
        if (type == QTextDocument::MarkdownResource)
            q->QTextEdit::setMarkdown(txt);
        else
#endif
#ifndef QT_NO_TEXTHTMLPARSER
        q->QTextEdit::setHtml(txt);
#else
        q->QTextEdit::setPlainText(txt);
#endif

#ifdef QT_KEYPAD_NAVIGATION
        prevFocus.movePosition(QTextCursor::Start);
#endif
    }

    forceLoadOnSourceChange = false;

    if (!url.fragment().isEmpty()) {
        q->scrollToAnchor(url.fragment());
    } else {
        hbar->setValue(0);
        vbar->setValue(0);
    }
#ifdef QT_KEYPAD_NAVIGATION
    lastKeypadScrollValue = vbar->value();
    emitHighlighted(QUrl());
#endif

#ifndef QT_NO_CURSOR
    if (q->isVisible())
        QGuiApplication::restoreOverrideCursor();
#endif
    emit q->sourceChanged(url);
}